

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.cc
# Opt level: O3

bool __thiscall
google::protobuf::internal::AnyMetadata::UnpackTo(AnyMetadata *this,Message *message)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  
  iVar2 = (*(message->super_MessageLite)._vptr_MessageLite[0x15])(message);
  bVar1 = InternalIs(this,**(StringPiece **)(CONCAT44(extraout_var,iVar2) + 8));
  if (bVar1) {
    bVar1 = MessageLite::ParseFromString(&message->super_MessageLite,this->value_->ptr_);
    return bVar1;
  }
  return false;
}

Assistant:

bool AnyMetadata::UnpackTo(Message* message) const {
  if (!InternalIs(message->GetDescriptor()->full_name())) {
    return false;
  }
  return message->ParseFromString(value_->GetNoArena());
}